

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stat_aggregator.cc
# Opt level: O1

void __thiscall StatAggregator::printValues(StatAggregator *this,samples_t *values,string *unit)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 uVar2;
  unsigned_long uVar3;
  pointer ppVar4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar5;
  unsigned_long uVar6;
  size_type sVar7;
  unsigned_long uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  size_type sVar13;
  int iVar14;
  Stats *stats;
  ulong uVar15;
  pointer puVar16;
  pointer pSVar17;
  pointer pcVar18;
  ulong uVar19;
  ulong uVar20;
  uint bin;
  long lVar21;
  pointer pSVar22;
  ulong uVar23;
  long lVar24;
  iterator __begin2;
  pointer puVar25;
  iterator __end2;
  unsigned_long *h;
  _Alloc_hider _Var26;
  pointer puVar27;
  long lVar28;
  pointer ppVar29;
  double dVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  double dVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  double dVar39;
  undefined4 uVar42;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  double dVar43;
  pair<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  pVar44;
  vector<Stats,_std::allocator<Stats>_> value_stats;
  vector<unsigned_long,_std::allocator<unsigned_long>_> histogram;
  vector<Stats,_std::allocator<Stats>_> local_c8;
  ulong local_a8;
  unsigned_long local_a0;
  value_type local_98;
  ulong local_38;
  
  local_c8.super__Vector_base<Stats,_std::allocator<Stats>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_c8.super__Vector_base<Stats,_std::allocator<Stats>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_c8.super__Vector_base<Stats,_std::allocator<Stats>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ppVar29 = (values->
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppVar4 = (values->
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar29 != ppVar4) {
    paVar1 = &local_98.name.field_2;
    do {
      local_98.name._M_string_length = 0;
      local_98.name.field_2._M_allocated_capacity =
           local_98.name.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_98.name._M_dataplus._M_p = (pointer)paVar1;
      if ((ppVar29->second->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
          _M_impl.super__Vector_impl_data._M_finish !=
          (ppVar29->second->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
          _M_impl.super__Vector_impl_data._M_start) {
        std::__cxx11::string::_M_assign((string *)&local_98);
        pvVar5 = ppVar29->second;
        puVar25 = (pvVar5->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        puVar27 = (pvVar5->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
        local_98.values = pvVar5;
        if (puVar25 != puVar27) {
          uVar15 = (long)puVar27 - (long)puVar25 >> 3;
          lVar24 = 0x3f;
          if (uVar15 != 0) {
            for (; uVar15 >> lVar24 == 0; lVar24 = lVar24 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (puVar25,puVar27,((uint)lVar24 ^ 0x3f) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (puVar25,puVar27);
        }
        puVar25 = (pvVar5->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        puVar27 = (pvVar5->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
        lVar24 = (long)puVar27 - (long)puVar25 >> 3;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = (ulong)(lVar24 * 0x32) >> 2;
        auVar10._8_8_ = 0;
        auVar10._0_8_ = (ulong)(lVar24 * 5) >> 2;
        auVar11._8_8_ = 0;
        auVar11._0_8_ = (ulong)(lVar24 * 0x5f) >> 2;
        auVar12._8_8_ = 0;
        auVar12._0_8_ = (ulong)(lVar24 * 99) >> 2;
        uVar2 = *(undefined8 *)
                 ((long)puVar25 +
                 (SUB168(auVar9 * ZEXT816(0x28f5c28f5c28f5c3),8) & 0xfffffffffffffffc) * 2);
        auVar31._8_4_ = (int)((ulong)uVar2 >> 0x20);
        auVar31._0_8_ = uVar2;
        auVar31._12_4_ = 0x45300000;
        local_98.median =
             (auVar31._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0);
        uVar15 = *(ulong *)((long)puVar25 +
                           (SUB168(auVar11 * ZEXT816(0x28f5c28f5c28f5c3),8) & 0xfffffffffffffffc) *
                           2);
        uVar20 = *(ulong *)((long)puVar25 +
                           (SUB168(auVar10 * ZEXT816(0x28f5c28f5c28f5c3),8) & 0xfffffffffffffffc) *
                           2);
        local_98.pct5 =
             ((double)(uVar20 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
             (double)(uVar20 & 0xffffffff | 0x4330000000000000);
        local_98.pct95 =
             ((double)(uVar15 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
             (double)(uVar15 & 0xffffffff | 0x4330000000000000);
        uVar2 = *(undefined8 *)
                 ((long)puVar25 +
                 (SUB168(auVar12 * ZEXT816(0x28f5c28f5c28f5c3),8) & 0xfffffffffffffffc) * 2);
        auVar32._8_4_ = (int)((ulong)uVar2 >> 0x20);
        auVar32._0_8_ = uVar2;
        auVar32._12_4_ = 0x45300000;
        local_98.pct99 =
             (auVar32._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0);
        dVar30 = 0.0;
        local_98.mean = 0.0;
        for (puVar16 = puVar25; puVar27 != puVar16; puVar16 = puVar16 + 1) {
          uVar3 = *puVar16;
          auVar36._8_4_ = (int)(uVar3 >> 0x20);
          auVar36._0_8_ = uVar3;
          auVar36._12_4_ = 0x45300000;
          local_98.mean =
               local_98.mean +
               (auVar36._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0);
        }
        auVar37._8_4_ = (int)((long)puVar27 - (long)puVar25 >> 0x23);
        auVar37._0_8_ = lVar24;
        auVar37._12_4_ = 0x45300000;
        local_98.mean =
             local_98.mean /
             ((auVar37._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar24) - 4503599627370496.0));
        if (puVar25 != puVar27) {
          dVar30 = 0.0;
          do {
            uVar3 = *puVar25;
            auVar38._8_4_ = (int)(uVar3 >> 0x20);
            auVar38._0_8_ = uVar3;
            auVar38._12_4_ = 0x45300000;
            dVar39 = ((auVar38._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) - local_98.mean
            ;
            dVar30 = dVar30 + dVar39 * dVar39;
            puVar25 = puVar25 + 1;
          } while (puVar25 != puVar27);
        }
        lVar24 = lVar24 + -1;
        auVar33._8_4_ = (int)((ulong)lVar24 >> 0x20);
        auVar33._0_8_ = lVar24;
        auVar33._12_4_ = 0x45300000;
        dVar30 = dVar30 / ((auVar33._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)lVar24) - 4503599627370496.0));
        if (dVar30 < 0.0) {
          local_98.stddev = sqrt(dVar30);
        }
        else {
          local_98.stddev = SQRT(dVar30);
        }
        std::vector<Stats,_std::allocator<Stats>_>::push_back(&local_c8,&local_98);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98.name._M_dataplus._M_p != paVar1) {
        operator_delete(local_98.name._M_dataplus._M_p);
      }
      ppVar29 = ppVar29 + 1;
    } while (ppVar29 != ppVar4);
  }
  local_a8 = 0xffffffffffffffff;
  uVar15 = 0;
  pSVar17 = local_c8.super__Vector_base<Stats,_std::allocator<Stats>_>._M_impl.
            super__Vector_impl_data._M_start;
  while( true ) {
    uVar42 = (undefined4)(uVar15 >> 0x20);
    if (pSVar17 ==
        local_c8.super__Vector_base<Stats,_std::allocator<Stats>_>._M_impl.super__Vector_impl_data.
        _M_finish) break;
    auVar40._8_4_ = (int)(local_a8 >> 0x20);
    auVar40._0_8_ = local_a8;
    auVar40._12_4_ = 0x45300000;
    dVar39 = (auVar40._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)local_a8) - 4503599627370496.0);
    dVar30 = pSVar17->pct5;
    if (dVar39 <= pSVar17->pct5) {
      dVar30 = dVar39;
    }
    local_a8 = (long)(dVar30 - 9.223372036854776e+18) & (long)dVar30 >> 0x3f | (long)dVar30;
    auVar41._8_4_ = uVar42;
    auVar41._0_8_ = uVar15;
    auVar41._12_4_ = 0x45300000;
    dVar39 = (auVar41._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar15) - 4503599627370496.0);
    dVar30 = pSVar17->pct95;
    if (pSVar17->pct95 <= dVar39) {
      dVar30 = dVar39;
    }
    uVar15 = (long)(dVar30 - 9.223372036854776e+18) & (long)dVar30 >> 0x3f | (long)dVar30;
    pSVar17 = pSVar17 + 1;
  }
  puts("\n                                Percentile");
  printf("  %-16s Median     95th     99th  Std Dev  Histogram of samples\n\n","");
  pSVar17 = local_c8.super__Vector_base<Stats,_std::allocator<Stats>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (local_c8.super__Vector_base<Stats,_std::allocator<Stats>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_c8.super__Vector_base<Stats,_std::allocator<Stats>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    local_38 = uVar15 >> 5;
    pSVar22 = local_c8.super__Vector_base<Stats,_std::allocator<Stats>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      uVar20 = local_38;
      iVar14 = std::__cxx11::string::compare((char *)unit);
      if (iVar14 == 0) {
        pcVar18 = (pSVar22->name)._M_dataplus._M_p;
        dVar30 = pSVar22->median;
        dVar39 = pSVar22->pct95;
        dVar35 = pSVar22->pct99;
        dVar43 = pSVar22->stddev;
      }
      else {
        iVar14 = std::__cxx11::string::compare((char *)unit);
        pcVar18 = (pSVar22->name)._M_dataplus._M_p;
        if (iVar14 == 0) {
          dVar43 = 1000.0;
        }
        else {
          dVar43 = 1000000.0;
        }
        dVar30 = pSVar22->median / dVar43;
        dVar39 = pSVar22->pct95 / dVar43;
        dVar35 = pSVar22->pct99 / dVar43;
        dVar43 = pSVar22->stddev / dVar43;
      }
      printf("%-16s %8.03f %8.03f %8.03f %8.03f  ",dVar30,dVar39,dVar35,dVar43,pcVar18);
      local_98.name._M_dataplus._M_p = (pointer)0x0;
      local_98.name._M_string_length = 0;
      local_98.name.field_2._M_allocated_capacity = 0;
      lVar21 = 0;
      lVar24 = 0;
      do {
        puVar25 = (pSVar22->values->
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar19 = (long)(pSVar22->values->
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)puVar25 >> 3;
        puVar27 = puVar25;
        if (0 < (long)uVar19) {
          do {
            uVar23 = uVar19 >> 1;
            uVar19 = ~uVar23 + uVar19;
            puVar16 = puVar27 + uVar23 + 1;
            if (uVar20 * lVar21 <= (puVar27 + uVar23 + 1)[-1]) {
              uVar19 = uVar23;
              puVar16 = puVar27;
            }
            puVar27 = puVar16;
          } while (0 < (long)uVar19);
        }
        lVar28 = (long)puVar27 - (long)puVar25 >> 3;
        local_a0 = (unsigned_long)((int)lVar28 - (int)lVar24);
        if (local_98.name._M_string_length == local_98.name.field_2._M_allocated_capacity) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_98,
                     (iterator)local_98.name._M_string_length,&local_a0);
        }
        else {
          *(unsigned_long *)local_98.name._M_string_length = local_a0;
          local_98.name._M_string_length = local_98.name._M_string_length + 8;
        }
        lVar21 = lVar21 + 1;
        lVar24 = lVar28;
      } while (lVar21 != 0x20);
      pVar44 = std::
               __minmax_element<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                         (local_98.name._M_dataplus._M_p,local_98.name._M_string_length);
      sVar13 = local_98.name._M_string_length;
      if (local_98.name._M_dataplus._M_p != (pointer)local_98.name._M_string_length) {
        uVar3 = *pVar44.second._M_current._M_current;
        uVar6 = *pVar44.first._M_current._M_current;
        _Var26._M_p = local_98.name._M_dataplus._M_p;
        do {
          sVar7 = *(size_type *)_Var26._M_p;
          uVar8 = *pVar44.first._M_current._M_current;
          putchar(-0x1e);
          putchar(-0x6a);
          putchar((int)(((sVar7 - uVar8) * 7 + 7) / ((uVar3 - uVar6) + 1)) + -0x7f);
          _Var26._M_p = _Var26._M_p + 8;
        } while (_Var26._M_p != (pointer)sVar13);
      }
      putchar(10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98.name._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_98.name._M_dataplus._M_p);
      }
      pSVar22 = pSVar22 + 1;
    } while (pSVar22 != pSVar17);
  }
  iVar14 = std::__cxx11::string::compare((char *)unit);
  if (iVar14 == 0) {
    pcVar18 = (unit->_M_dataplus)._M_p;
    uVar20 = local_a8;
  }
  else {
    iVar14 = std::__cxx11::string::compare((char *)unit);
    auVar34._8_4_ = (int)(local_a8 >> 0x20);
    auVar34._0_8_ = local_a8;
    auVar34._12_4_ = 0x45300000;
    pcVar18 = (unit->_M_dataplus)._M_p;
    if (iVar14 == 0) {
      dVar30 = 1000.0;
    }
    else {
      dVar30 = 1000000.0;
    }
    uVar15 = (ulong)(uint)(int)((((double)CONCAT44(0x45300000,uVar42) - 1.9342813113834067e+25) +
                                ((double)CONCAT44(0x43300000,(int)uVar15) - 4503599627370496.0)) /
                               dVar30);
    uVar20 = (ulong)(uint)(int)(((auVar34._8_8_ - 1.9342813113834067e+25) +
                                ((double)CONCAT44(0x43300000,(int)local_a8) - 4503599627370496.0)) /
                               dVar30);
  }
  printf("%52s  %-14d %s %14d\n","",uVar20,pcVar18,uVar15);
  std::vector<Stats,_std::allocator<Stats>_>::~vector(&local_c8);
  return;
}

Assistant:

void StatAggregator::printValues(samples_t values, std::string unit) {

    // First, calculate mean, median, standard deviation and percentiles
    // of each set of values, both for printing and to derive what the
    // range of the graphs should be.
    std::vector<Stats> value_stats;
    for (const auto& t : values) {
        Stats stats;
        if (t.second->size() == 0) {
            continue;
        }
        stats.name = t.first;
        stats.values = t.second;
        std::vector<uint64_t>& vec = *t.second;

        // Calculate latency percentiles
        std::sort(vec.begin(), vec.end());
        stats.median = vec[(vec.size() * 50) / 100];
        stats.pct5 = vec[(vec.size() * 5) / 100];
        stats.pct95 = vec[(vec.size() * 95) / 100];
        stats.pct99 = vec[(vec.size() * 99) / 100];

        const double sum = std::accumulate(vec.begin(), vec.end(), 0.0);
        stats.mean = sum / vec.size();
        double accum = 0.0;
        for (auto &d : vec) {
            accum += (d - stats.mean) * (d - stats.mean);
        }
        stats.stddev = sqrt(accum / (vec.size() - 1));

        value_stats.push_back(stats);
    }

    // From these find the start and end for the spark graphs which covers the
    // a "reasonable sample" of each value set. We define that as from the 5th
    // to the 95th percentile, so we ensure *all* sets have that range covered.
    uint64_t spark_start = std::numeric_limits<uint64_t>::max();
    uint64_t spark_end = 0;
    for (const auto& stats : value_stats) {
        spark_start = (stats.pct5 < spark_start) ? stats.pct5 : spark_start;
        spark_end = (stats.pct95 > spark_end) ? stats.pct95 : spark_end;
    }

    printf("\n                                Percentile\n");
    printf("  %-16s Median     95th     99th  Std Dev  "
            "Histogram of samples\n\n", "");
    // Finally, print out each set.
    for (const auto& stats : value_stats) {
        if (unit == "µs") {
            printf("%-16s %8.03f %8.03f %8.03f %8.03f  ",
                    stats.name.c_str(), stats.median, stats.pct95,
                    stats.pct99, stats.stddev);
        } else if (unit == "ms") {
            printf("%-16s %8.03f %8.03f %8.03f %8.03f  ",
                    stats.name.c_str(), stats.median/1e3, stats.pct95/1e3,
                    stats.pct99/1e3, stats.stddev/1e3);
        } else {    // unit == "s"
            printf("%-16s %8.03f %8.03f %8.03f %8.03f  ",
                    stats.name.c_str(), stats.median/1e6, stats.pct95/1e6,
                    stats.pct99/1e6, stats.stddev/1e6);
        }

        // Calculate and render Sparkline (requires UTF-8 terminal).
        const int nbins = 32;
        int prev_distance = 0;
        std::vector<size_t> histogram;
        for (unsigned int bin = 0; bin < nbins; bin++) {
            const uint64_t max_for_bin = (spark_end / nbins) * bin;
            auto it = std::lower_bound(stats.values->begin(),
                                       stats.values->end(),
                                       max_for_bin);
            const int distance = std::distance(stats.values->begin(), it);
            histogram.push_back(distance - prev_distance);
            prev_distance = distance;
        }

        const auto minmax = std::minmax_element(histogram.begin(),
                                                histogram.end());
        const size_t range = *minmax.second - *minmax.first + 1;
        const int levels = 8;
        for (const auto& h : histogram) {
            int bar_size = ((h - *minmax.first + 1) * (levels - 1)) / range;
            putchar('\xe2');
            putchar('\x96');
            putchar('\x81' + bar_size);
        }
        putchar('\n');
    }
    if (unit == "µs") {
        printf("%52s  %-14d %s %14d\n", "",
               int(spark_start), unit.c_str(), int(spark_end));
    } else if (unit == "ms") {
        printf("%52s  %-14d %s %14d\n", "",
               int(spark_start/1e3), unit.c_str(), int(spark_end/1e3));
    } else {    // unit == "s"
        printf("%52s  %-14d %s %14d\n", "",
               int(spark_start/1e6), unit.c_str(), int(spark_end/1e6));
    }
}